

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O3

void dumpStdConnTable(FILE *outf)

{
  StdResConnTableEntry_t *pSVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    fprintf((FILE *)outf,"%5d] ",uVar2 & 0xffffffff);
    for (pSVar1 = StdResTblBucket[uVar2]; pSVar1 != (StdResConnTableEntry_t *)0x0;
        pSVar1 = pSVar1->next) {
      fprintf((FILE *)outf,"(\"%s\" --> \"%s\") ",pSVar1->key,pSVar1->value);
    }
    fputc(10,(FILE *)outf);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0xa39);
  return;
}

Assistant:

void dumpStdConnTable(FILE * outf) {
   int h;
   StdResConnTableEntry_t *t;

   for (h = 0; h < M; h++) {
      fprintf(outf, "%5d] ", h);
      for (t = StdResTblBucket[h]; t; t = t->next) {
	 fprintf(outf, "(\"%s\" --> \"%s\") ", t->key, t->value);
      }
      fprintf(outf, "\n");
   }
}